

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryUint::test
          (ShaderBitfieldOperationCaseUnaryUint *this,Data *data)

{
  GLuint GVar1;
  uint uVar2;
  GLuint sign_extend;
  GLuint output_9bits;
  GLuint output;
  GLuint expected;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseUnaryUint *this_local;
  
  output = 0;
  while( true ) {
    if (this->m_components <= (int)output) {
      return true;
    }
    GVar1 = (*this->m_func)(data->inUvec4[(int)output]);
    sign_extend = data->outUvec4[(int)output];
    if ((((this->m_func == bitCount) || (this->m_func == findLSB)) || (this->m_func == findMSBU)) ||
       (this->m_func == findMSBI)) {
      uVar2 = 0;
      if ((sign_extend & 0x100) != 0) {
        uVar2 = 0xfffffe00;
      }
      sign_extend = sign_extend & 0x1ff | uVar2;
    }
    if (sign_extend != GVar1) break;
    output = output + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected = m_func(data->inUvec4[i]);
			GLuint output   = data->outUvec4[i];
			if (m_func == (UnaryUFunc)glcts::bitCount || m_func == (UnaryUFunc)glcts::findLSB ||
				m_func == (UnaryUFunc)glcts::findMSBU || m_func == (UnaryUFunc)glcts::findMSBI)
			{
				/* The built-in bitCount, findLSB and findMSB functions
				 * return a lowp int, which can be encoded with as little
				 * as 9 bits. Since findLSB and findMSB can return negative
				 * values (namely, -1), we cannot compare the value directly
				 * against a (32-bit) GLuint.
				 */
				GLuint output_9bits = output & 0x1ff;
				GLuint sign_extend  = output_9bits & 0x100 ? 0xfffffe00 : 0;
				output				= output_9bits | sign_extend;
			}

			if (output != expected)
			{
				return false;
			}
		}
		return true;
	}